

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O3

size_t __thiscall proto3_unittest::TestHasbits::ByteSizeLong(TestHasbits *this)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong in_RSI;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  uVar2 = (this->field_0)._impl_._has_bits_.has_bits_[0];
  if ((char)uVar2 == '\0') {
    uVar7 = 0;
  }
  else {
    auVar17._0_4_ = -(uint)((uVar2 & 8) == 0);
    auVar17._4_4_ = -(uint)((uVar2 & 4) == 0);
    auVar17._8_4_ = -(uint)((uVar2 & 2) == 0);
    auVar17._12_4_ = -(uint)((uVar2 & 1) == 0);
    auVar16._0_4_ = -(uint)((uVar2 & 0x80) == 0);
    auVar16._4_4_ = -(uint)((uVar2 & 0x40) == 0);
    auVar16._8_4_ = -(uint)((uVar2 & 0x20) == 0);
    auVar16._12_4_ = -(uint)((uVar2 & 0x10) == 0);
    auVar17 = packssdw(auVar16,auVar17);
    auVar17 = packsswb(auVar17,auVar17);
    uVar7 = 0;
    if ((auVar17 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar7 = (ulong)(((this->field_0)._impl_.b1_ & 1) * 2);
    }
    uVar5 = uVar7 + 2;
    if (((this->field_0)._impl_.b2_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 2;
    if (((this->field_0)._impl_.b3_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = uVar5;
    }
    uVar5 = uVar7 + 2;
    if (((this->field_0)._impl_.b4_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    in_RSI = uVar5 + 2;
    if (((this->field_0)._impl_.b5_ & 1U) == 0) {
      in_RSI = uVar5;
    }
    if ((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      in_RSI = uVar5;
    }
    uVar5 = in_RSI + 2;
    if (((this->field_0)._impl_.b6_ & 1U) == 0) {
      uVar5 = in_RSI;
    }
    if ((auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = in_RSI;
    }
    uVar7 = uVar5 + 2;
    if (((this->field_0)._impl_.b7_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = uVar5;
    }
    if (((auVar17 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       ((this->field_0)._impl_.b8_ != false)) {
      uVar7 = uVar7 + 2;
    }
  }
  if ((uVar2 & 0xff00) != 0) {
    uVar5 = uVar7 + 2;
    if (((this->field_0)._impl_.b9_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    auVar8._0_4_ = -(uint)((uVar2 & 0x800) == 0);
    auVar8._4_4_ = -(uint)((uVar2 & 0x400) == 0);
    auVar8._8_4_ = -(uint)((uVar2 & 0x200) == 0);
    auVar8._12_4_ = -(uint)((uVar2 & 0x100) == 0);
    auVar18._0_4_ = -(uint)((uVar2 & 0x8000) == 0);
    auVar18._4_4_ = -(uint)((uVar2 & 0x4000) == 0);
    auVar18._8_4_ = -(uint)((uVar2 & 0x2000) == 0);
    auVar18._12_4_ = -(uint)((uVar2 & 0x1000) == 0);
    auVar17 = packssdw(auVar18,auVar8);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 2;
    if (((this->field_0)._impl_.b10_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = uVar5;
    }
    uVar5 = uVar7 + 2;
    if (((this->field_0)._impl_.b11_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 2;
    if (((this->field_0)._impl_.b12_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = uVar5;
    }
    uVar5 = uVar7 + 2;
    if (((this->field_0)._impl_.b13_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    in_RSI = uVar5 + 2;
    if (((this->field_0)._impl_.b14_ & 1U) == 0) {
      in_RSI = uVar5;
    }
    if ((auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      in_RSI = uVar5;
    }
    uVar7 = in_RSI + 2;
    if (((this->field_0)._impl_.b15_ & 1U) == 0) {
      uVar7 = in_RSI;
    }
    if ((auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = in_RSI;
    }
    if (((auVar17 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       ((this->field_0)._impl_.b16_ != false)) {
      uVar7 = uVar7 + 3;
    }
  }
  if ((uVar2 & 0xff0000) != 0) {
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b17_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    auVar9._0_4_ = -(uint)((uVar2 & 0x80000) == 0);
    auVar9._4_4_ = -(uint)((uVar2 & 0x40000) == 0);
    auVar9._8_4_ = -(uint)((uVar2 & 0x20000) == 0);
    auVar9._12_4_ = -(uint)((uVar2 & 0x10000) == 0);
    auVar19._0_4_ = -(uint)((uVar2 & 0x800000) == 0);
    auVar19._4_4_ = -(uint)((uVar2 & 0x400000) == 0);
    auVar19._8_4_ = -(uint)((uVar2 & 0x200000) == 0);
    auVar19._12_4_ = -(uint)((uVar2 & 0x100000) == 0);
    auVar17 = packssdw(auVar19,auVar9);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 3;
    if (((this->field_0)._impl_.b18_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = uVar5;
    }
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b19_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 3;
    if (((this->field_0)._impl_.b20_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = uVar5;
    }
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b21_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    in_RSI = uVar5 + 3;
    if (((this->field_0)._impl_.b22_ & 1U) == 0) {
      in_RSI = uVar5;
    }
    if ((auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      in_RSI = uVar5;
    }
    uVar7 = in_RSI + 3;
    if (((this->field_0)._impl_.b23_ & 1U) == 0) {
      uVar7 = in_RSI;
    }
    if ((auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = in_RSI;
    }
    if (((auVar17 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       ((this->field_0)._impl_.b24_ != false)) {
      uVar7 = uVar7 + 3;
    }
  }
  if (0xffffff < uVar2) {
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b25_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((uVar2 >> 0x18 & 1) == 0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 3;
    if (((this->field_0)._impl_.b26_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((uVar2 >> 0x19 & 1) == 0) {
      uVar7 = uVar5;
    }
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b27_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((uVar2 >> 0x1a & 1) == 0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 3;
    if (((this->field_0)._impl_.b28_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    auVar10._0_4_ = -(uint)((uVar2 & 0x40000000) == 0);
    auVar10._4_4_ = -(uint)((uVar2 & 0x20000000) == 0);
    auVar10._8_4_ = -(uint)((uVar2 & 0x10000000) == 0);
    auVar10._12_4_ = -(uint)((uVar2 & 0x8000000) == 0);
    uVar6 = movmskps((int)in_RSI,auVar10);
    in_RSI = (ulong)uVar6;
    if ((uVar6 & 8) != 0) {
      uVar7 = uVar5;
    }
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b29_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((uVar6 & 4) != 0) {
      uVar5 = uVar7;
    }
    uVar4 = uVar5 + 3;
    if (((this->field_0)._impl_.b30_ & 1U) == 0) {
      uVar4 = uVar5;
    }
    if ((uVar6 & 2) != 0) {
      uVar4 = uVar5;
    }
    uVar7 = uVar4 + 3;
    if (((this->field_0)._impl_.b31_ & 1U) == 0) {
      uVar7 = uVar4;
    }
    if ((uVar6 & 1) != 0) {
      uVar7 = uVar4;
    }
    if ((int)uVar2 < 0) {
      sVar3 = TestAllTypes::ByteSizeLong((this->field_0)._impl_.child_);
      uVar2 = (uint)sVar3 | 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar7 = uVar7 + sVar3 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
    }
  }
  uVar2 = (this->field_0)._impl_._has_bits_.has_bits_[1];
  if ((char)uVar2 != '\0') {
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b32_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    auVar11._0_4_ = -(uint)((uVar2 & 8) == 0);
    auVar11._4_4_ = -(uint)((uVar2 & 4) == 0);
    auVar11._8_4_ = -(uint)((uVar2 & 2) == 0);
    auVar11._12_4_ = -(uint)((uVar2 & 1) == 0);
    auVar20._0_4_ = -(uint)((uVar2 & 0x80) == 0);
    auVar20._4_4_ = -(uint)((uVar2 & 0x40) == 0);
    auVar20._8_4_ = -(uint)((uVar2 & 0x20) == 0);
    auVar20._12_4_ = -(uint)((uVar2 & 0x10) == 0);
    auVar17 = packssdw(auVar20,auVar11);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 3;
    if (((this->field_0)._impl_.b33_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = uVar5;
    }
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b34_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 3;
    if (((this->field_0)._impl_.b35_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = uVar5;
    }
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b36_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    in_RSI = uVar5 + 3;
    if (((this->field_0)._impl_.b37_ & 1U) == 0) {
      in_RSI = uVar5;
    }
    if ((auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      in_RSI = uVar5;
    }
    uVar7 = in_RSI + 3;
    if (((this->field_0)._impl_.b38_ & 1U) == 0) {
      uVar7 = in_RSI;
    }
    if ((auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = in_RSI;
    }
    if (((auVar17 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       ((this->field_0)._impl_.b39_ != false)) {
      uVar7 = uVar7 + 3;
    }
  }
  if ((uVar2 & 0xff00) != 0) {
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b40_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    auVar12._0_4_ = -(uint)((uVar2 & 0x800) == 0);
    auVar12._4_4_ = -(uint)((uVar2 & 0x400) == 0);
    auVar12._8_4_ = -(uint)((uVar2 & 0x200) == 0);
    auVar12._12_4_ = -(uint)((uVar2 & 0x100) == 0);
    auVar21._0_4_ = -(uint)((uVar2 & 0x8000) == 0);
    auVar21._4_4_ = -(uint)((uVar2 & 0x4000) == 0);
    auVar21._8_4_ = -(uint)((uVar2 & 0x2000) == 0);
    auVar21._12_4_ = -(uint)((uVar2 & 0x1000) == 0);
    auVar17 = packssdw(auVar21,auVar12);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 3;
    if (((this->field_0)._impl_.b41_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = uVar5;
    }
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b42_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 3;
    if (((this->field_0)._impl_.b43_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = uVar5;
    }
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b44_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    in_RSI = uVar5 + 3;
    if (((this->field_0)._impl_.b45_ & 1U) == 0) {
      in_RSI = uVar5;
    }
    if ((auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      in_RSI = uVar5;
    }
    uVar7 = in_RSI + 3;
    if (((this->field_0)._impl_.b46_ & 1U) == 0) {
      uVar7 = in_RSI;
    }
    if ((auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = in_RSI;
    }
    if (((auVar17 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       ((this->field_0)._impl_.b47_ != false)) {
      uVar7 = uVar7 + 3;
    }
  }
  if ((uVar2 & 0xff0000) != 0) {
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b48_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    auVar13._0_4_ = -(uint)((uVar2 & 0x80000) == 0);
    auVar13._4_4_ = -(uint)((uVar2 & 0x40000) == 0);
    auVar13._8_4_ = -(uint)((uVar2 & 0x20000) == 0);
    auVar13._12_4_ = -(uint)((uVar2 & 0x10000) == 0);
    auVar22._0_4_ = -(uint)((uVar2 & 0x800000) == 0);
    auVar22._4_4_ = -(uint)((uVar2 & 0x400000) == 0);
    auVar22._8_4_ = -(uint)((uVar2 & 0x200000) == 0);
    auVar22._12_4_ = -(uint)((uVar2 & 0x100000) == 0);
    auVar17 = packssdw(auVar22,auVar13);
    auVar17 = packsswb(auVar17,auVar17);
    if ((auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 3;
    if (((this->field_0)._impl_.b49_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = uVar5;
    }
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b50_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 3;
    if (((this->field_0)._impl_.b51_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = uVar5;
    }
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b52_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar5 = uVar7;
    }
    in_RSI = uVar5 + 3;
    if (((this->field_0)._impl_.b53_ & 1U) == 0) {
      in_RSI = uVar5;
    }
    if ((auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      in_RSI = uVar5;
    }
    uVar7 = in_RSI + 3;
    if (((this->field_0)._impl_.b54_ & 1U) == 0) {
      uVar7 = in_RSI;
    }
    if ((auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar7 = in_RSI;
    }
    if (((auVar17 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       ((this->field_0)._impl_.b55_ != false)) {
      uVar7 = uVar7 + 3;
    }
  }
  if (0xffffff < uVar2) {
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b56_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((uVar2 >> 0x18 & 1) == 0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 3;
    if (((this->field_0)._impl_.b57_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((uVar2 >> 0x19 & 1) == 0) {
      uVar7 = uVar5;
    }
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b58_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((uVar2 >> 0x1a & 1) == 0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 3;
    if (((this->field_0)._impl_.b59_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    auVar14._0_4_ = -(uint)((uVar2 & 0x40000000) == 0);
    auVar14._4_4_ = -(uint)((uVar2 & 0x20000000) == 0);
    auVar14._8_4_ = -(uint)((uVar2 & 0x10000000) == 0);
    auVar14._12_4_ = -(uint)((uVar2 & 0x8000000) == 0);
    uVar6 = movmskps((int)in_RSI,auVar14);
    if ((uVar6 & 8) != 0) {
      uVar7 = uVar5;
    }
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b60_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((uVar6 & 4) != 0) {
      uVar5 = uVar7;
    }
    uVar4 = uVar5 + 3;
    if (((this->field_0)._impl_.b61_ & 1U) == 0) {
      uVar4 = uVar5;
    }
    if ((uVar6 & 2) != 0) {
      uVar4 = uVar5;
    }
    uVar7 = uVar4 + 3;
    if (((this->field_0)._impl_.b62_ & 1U) == 0) {
      uVar7 = uVar4;
    }
    if ((uVar6 & 1) != 0) {
      uVar7 = uVar4;
    }
    if (((int)uVar2 < 0) && ((this->field_0)._impl_.b63_ != false)) {
      uVar7 = uVar7 + 3;
    }
  }
  uVar2 = (this->field_0)._impl_._has_bits_.has_bits_[2];
  if ((uVar2 & 0x3f) != 0) {
    uVar5 = uVar7 + 3;
    if (((this->field_0)._impl_.b64_ & 1U) == 0) {
      uVar5 = uVar7;
    }
    if ((uVar2 & 1) == 0) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5 + 3;
    if (((this->field_0)._impl_.b65_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((uVar2 & 2) == 0) {
      uVar7 = uVar5;
    }
    uVar4 = uVar7 + 3;
    if (((this->field_0)._impl_.b66_ & 1U) == 0) {
      uVar4 = uVar7;
    }
    auVar15._0_4_ = -(uint)((uVar2 & 0x20) == 0);
    auVar15._4_4_ = -(uint)((uVar2 & 0x10) == 0);
    auVar15._8_4_ = -(uint)((uVar2 & 8) == 0);
    auVar15._12_4_ = -(uint)((uVar2 & 4) == 0);
    uVar2 = movmskps((int)uVar5,auVar15);
    if ((uVar2 & 8) != 0) {
      uVar4 = uVar7;
    }
    uVar5 = uVar4 + 3;
    if (((this->field_0)._impl_.b67_ & 1U) == 0) {
      uVar5 = uVar4;
    }
    if ((uVar2 & 4) != 0) {
      uVar5 = uVar4;
    }
    uVar7 = uVar5 + 3;
    if (((this->field_0)._impl_.b68_ & 1U) == 0) {
      uVar7 = uVar5;
    }
    if ((uVar2 & 2) != 0) {
      uVar7 = uVar5;
    }
    if (((uVar2 & 1) == 0) && ((this->field_0)._impl_.b69_ != false)) {
      uVar7 = uVar7 + 3;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,uVar7,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestHasbits::ByteSizeLong() const {
  const TestHasbits& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3_unittest.TestHasbits)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // bool b1 = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (this_._internal_b1() != 0) {
        total_size += 2;
      }
    }
    // bool b2 = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (this_._internal_b2() != 0) {
        total_size += 2;
      }
    }
    // bool b3 = 3;
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (this_._internal_b3() != 0) {
        total_size += 2;
      }
    }
    // bool b4 = 4;
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (this_._internal_b4() != 0) {
        total_size += 2;
      }
    }
    // bool b5 = 5;
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (this_._internal_b5() != 0) {
        total_size += 2;
      }
    }
    // bool b6 = 6;
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (this_._internal_b6() != 0) {
        total_size += 2;
      }
    }
    // bool b7 = 7;
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (this_._internal_b7() != 0) {
        total_size += 2;
      }
    }
    // bool b8 = 8;
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (this_._internal_b8() != 0) {
        total_size += 2;
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    // bool b9 = 9;
    if ((cached_has_bits & 0x00000100u) != 0) {
      if (this_._internal_b9() != 0) {
        total_size += 2;
      }
    }
    // bool b10 = 10;
    if ((cached_has_bits & 0x00000200u) != 0) {
      if (this_._internal_b10() != 0) {
        total_size += 2;
      }
    }
    // bool b11 = 11;
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (this_._internal_b11() != 0) {
        total_size += 2;
      }
    }
    // bool b12 = 12;
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (this_._internal_b12() != 0) {
        total_size += 2;
      }
    }
    // bool b13 = 13;
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (this_._internal_b13() != 0) {
        total_size += 2;
      }
    }
    // bool b14 = 14;
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (this_._internal_b14() != 0) {
        total_size += 2;
      }
    }
    // bool b15 = 15;
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (this_._internal_b15() != 0) {
        total_size += 2;
      }
    }
    // bool b16 = 16;
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (this_._internal_b16() != 0) {
        total_size += 3;
      }
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    // bool b17 = 17;
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (this_._internal_b17() != 0) {
        total_size += 3;
      }
    }
    // bool b18 = 18;
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (this_._internal_b18() != 0) {
        total_size += 3;
      }
    }
    // bool b19 = 19;
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (this_._internal_b19() != 0) {
        total_size += 3;
      }
    }
    // bool b20 = 20;
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (this_._internal_b20() != 0) {
        total_size += 3;
      }
    }
    // bool b21 = 21;
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (this_._internal_b21() != 0) {
        total_size += 3;
      }
    }
    // bool b22 = 22;
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (this_._internal_b22() != 0) {
        total_size += 3;
      }
    }
    // bool b23 = 23;
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (this_._internal_b23() != 0) {
        total_size += 3;
      }
    }
    // bool b24 = 24;
    if ((cached_has_bits & 0x00800000u) != 0) {
      if (this_._internal_b24() != 0) {
        total_size += 3;
      }
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    // bool b25 = 25;
    if ((cached_has_bits & 0x01000000u) != 0) {
      if (this_._internal_b25() != 0) {
        total_size += 3;
      }
    }
    // bool b26 = 26;
    if ((cached_has_bits & 0x02000000u) != 0) {
      if (this_._internal_b26() != 0) {
        total_size += 3;
      }
    }
    // bool b27 = 27;
    if ((cached_has_bits & 0x04000000u) != 0) {
      if (this_._internal_b27() != 0) {
        total_size += 3;
      }
    }
    // bool b28 = 28;
    if ((cached_has_bits & 0x08000000u) != 0) {
      if (this_._internal_b28() != 0) {
        total_size += 3;
      }
    }
    // bool b29 = 29;
    if ((cached_has_bits & 0x10000000u) != 0) {
      if (this_._internal_b29() != 0) {
        total_size += 3;
      }
    }
    // bool b30 = 30;
    if ((cached_has_bits & 0x20000000u) != 0) {
      if (this_._internal_b30() != 0) {
        total_size += 3;
      }
    }
    // bool b31 = 31;
    if ((cached_has_bits & 0x40000000u) != 0) {
      if (this_._internal_b31() != 0) {
        total_size += 3;
      }
    }
    // .proto3_unittest.TestAllTypes child = 100;
    if ((cached_has_bits & 0x80000000u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.child_);
    }
  }
  cached_has_bits = this_._impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // bool b32 = 32;
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (this_._internal_b32() != 0) {
        total_size += 3;
      }
    }
    // bool b33 = 33;
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (this_._internal_b33() != 0) {
        total_size += 3;
      }
    }
    // bool b34 = 34;
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (this_._internal_b34() != 0) {
        total_size += 3;
      }
    }
    // bool b35 = 35;
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (this_._internal_b35() != 0) {
        total_size += 3;
      }
    }
    // bool b36 = 36;
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (this_._internal_b36() != 0) {
        total_size += 3;
      }
    }
    // bool b37 = 37;
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (this_._internal_b37() != 0) {
        total_size += 3;
      }
    }
    // bool b38 = 38;
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (this_._internal_b38() != 0) {
        total_size += 3;
      }
    }
    // bool b39 = 39;
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (this_._internal_b39() != 0) {
        total_size += 3;
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    // bool b40 = 40;
    if ((cached_has_bits & 0x00000100u) != 0) {
      if (this_._internal_b40() != 0) {
        total_size += 3;
      }
    }
    // bool b41 = 41;
    if ((cached_has_bits & 0x00000200u) != 0) {
      if (this_._internal_b41() != 0) {
        total_size += 3;
      }
    }
    // bool b42 = 42;
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (this_._internal_b42() != 0) {
        total_size += 3;
      }
    }
    // bool b43 = 43;
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (this_._internal_b43() != 0) {
        total_size += 3;
      }
    }
    // bool b44 = 44;
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (this_._internal_b44() != 0) {
        total_size += 3;
      }
    }
    // bool b45 = 45;
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (this_._internal_b45() != 0) {
        total_size += 3;
      }
    }
    // bool b46 = 46;
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (this_._internal_b46() != 0) {
        total_size += 3;
      }
    }
    // bool b47 = 47;
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (this_._internal_b47() != 0) {
        total_size += 3;
      }
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    // bool b48 = 48;
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (this_._internal_b48() != 0) {
        total_size += 3;
      }
    }
    // bool b49 = 49;
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (this_._internal_b49() != 0) {
        total_size += 3;
      }
    }
    // bool b50 = 50;
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (this_._internal_b50() != 0) {
        total_size += 3;
      }
    }
    // bool b51 = 51;
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (this_._internal_b51() != 0) {
        total_size += 3;
      }
    }
    // bool b52 = 52;
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (this_._internal_b52() != 0) {
        total_size += 3;
      }
    }
    // bool b53 = 53;
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (this_._internal_b53() != 0) {
        total_size += 3;
      }
    }
    // bool b54 = 54;
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (this_._internal_b54() != 0) {
        total_size += 3;
      }
    }
    // bool b55 = 55;
    if ((cached_has_bits & 0x00800000u) != 0) {
      if (this_._internal_b55() != 0) {
        total_size += 3;
      }
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    // bool b56 = 56;
    if ((cached_has_bits & 0x01000000u) != 0) {
      if (this_._internal_b56() != 0) {
        total_size += 3;
      }
    }
    // bool b57 = 57;
    if ((cached_has_bits & 0x02000000u) != 0) {
      if (this_._internal_b57() != 0) {
        total_size += 3;
      }
    }
    // bool b58 = 58;
    if ((cached_has_bits & 0x04000000u) != 0) {
      if (this_._internal_b58() != 0) {
        total_size += 3;
      }
    }
    // bool b59 = 59;
    if ((cached_has_bits & 0x08000000u) != 0) {
      if (this_._internal_b59() != 0) {
        total_size += 3;
      }
    }
    // bool b60 = 60;
    if ((cached_has_bits & 0x10000000u) != 0) {
      if (this_._internal_b60() != 0) {
        total_size += 3;
      }
    }
    // bool b61 = 61;
    if ((cached_has_bits & 0x20000000u) != 0) {
      if (this_._internal_b61() != 0) {
        total_size += 3;
      }
    }
    // bool b62 = 62;
    if ((cached_has_bits & 0x40000000u) != 0) {
      if (this_._internal_b62() != 0) {
        total_size += 3;
      }
    }
    // bool b63 = 63;
    if ((cached_has_bits & 0x80000000u) != 0) {
      if (this_._internal_b63() != 0) {
        total_size += 3;
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[2];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    // bool b64 = 64;
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (this_._internal_b64() != 0) {
        total_size += 3;
      }
    }
    // bool b65 = 65;
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (this_._internal_b65() != 0) {
        total_size += 3;
      }
    }
    // bool b66 = 66;
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (this_._internal_b66() != 0) {
        total_size += 3;
      }
    }
    // bool b67 = 67;
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (this_._internal_b67() != 0) {
        total_size += 3;
      }
    }
    // bool b68 = 68;
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (this_._internal_b68() != 0) {
        total_size += 3;
      }
    }
    // bool b69 = 69;
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (this_._internal_b69() != 0) {
        total_size += 3;
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}